

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_28494c::CAPIBuildSystemFrontendDelegate::commandProcessFinished
          (CAPIBuildSystemFrontendDelegate *this,Command *command,ProcessHandle handle,
          ProcessResult *commandResult)

{
  _func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_process_t_ptr_llb_buildsystem_command_extended_result_t_ptr
  *p_Var1;
  llb_buildsystem_command_extended_result_t local_28;
  
  p_Var1 = (this->cAPIDelegate).command_process_finished;
  if (p_Var1 != (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_process_t_ptr_llb_buildsystem_command_extended_result_t_ptr
                 *)0x0) {
    local_28.result = commandResult->status;
    if (llb_buildsystem_command_result_skipped < local_28.result) {
      __assert_fail("0 && \"unknown command result\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                    ,0xab,
                    "llb_buildsystem_command_result_t (anonymous namespace)::get_command_result(ProcessStatus)"
                   );
    }
    local_28.exit_status = commandResult->exitCode;
    local_28.pid = commandResult->pid;
    local_28.utime._0_4_ = (undefined4)commandResult->utime;
    local_28.utime._4_4_ = *(undefined4 *)((long)&commandResult->utime + 4);
    local_28.stime._0_4_ = (undefined4)commandResult->stime;
    local_28.stime._4_4_ = *(undefined4 *)((long)&commandResult->stime + 4);
    local_28.maxrss = commandResult->maxrss;
    (*p_Var1)((this->cAPIDelegate).context,(llb_buildsystem_command_t *)command,
              (llb_buildsystem_process_t *)handle.id,&local_28);
  }
  return;
}

Assistant:

virtual void commandProcessFinished(Command* command, ProcessHandle handle,
                                      const ProcessResult& commandResult) override {
    if (cAPIDelegate.command_process_finished) {
      llb_buildsystem_command_extended_result_t result;
      result.result = get_command_result(commandResult.status);
      result.exit_status = commandResult.exitCode;
      result.pid = commandResult.pid;
      result.utime = commandResult.utime;
      result.stime = commandResult.stime;
      result.maxrss = commandResult.maxrss;

      cAPIDelegate.command_process_finished(
          cAPIDelegate.context,
          (llb_buildsystem_command_t*) command,
          (llb_buildsystem_process_t*) handle.id,
          &result);
    }
  }